

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O0

void ClientObituary(AActor *self,AActor *inflictor,AActor *attacker,int dmgflags)

{
  AActor *pAVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MetaClass *pMVar5;
  MetaClass *pMVar6;
  size_t sVar7;
  char *victim;
  char *killer;
  int local_43c;
  char local_438 [4];
  int gender;
  char gendermessage [1024];
  char *messagename;
  char *message;
  FName mod;
  int dmgflags_local;
  AActor *attacker_local;
  AActor *inflictor_local;
  AActor *self_local;
  
  message._4_4_ = dmgflags;
  _mod = attacker;
  FName::FName((FName *)&message);
  if (self->player == (player_t *)0x0) {
    return;
  }
  if (self->player->mo != (APlayerPawn *)self) {
    return;
  }
  bVar2 = FBoolCVar::operator_cast_to_bool(&show_obituaries);
  if (!bVar2) {
    return;
  }
  local_43c = userinfo_t::GetGender(&self->player->userinfo);
  if (((inflictor != (AActor *)0x0) && (inflictor->player != (player_t *)0x0)) &&
     (inflictor->player->mo != (APlayerPawn *)inflictor)) {
    FName::operator=(&MeansOfDeath,NAME_None);
  }
  FName::operator=((FName *)&message,&MeansOfDeath);
  messagename = (char *)0x0;
  gendermessage[0x3f8] = '\0';
  gendermessage[0x3f9] = '\0';
  gendermessage[0x3fa] = '\0';
  gendermessage[0x3fb] = '\0';
  gendermessage[0x3fc] = '\0';
  gendermessage[0x3fd] = '\0';
  gendermessage[0x3fe] = '\0';
  gendermessage[0x3ff] = '\0';
  if ((_mod == (AActor *)0x0) || (_mod->player != (player_t *)0x0)) {
    bVar2 = FName::operator==((FName *)&message,NAME_Telefrag);
    if (bVar2) {
      bVar2 = AnnounceTelefrag(_mod,self);
      if (bVar2) {
        return;
      }
    }
    else {
      bVar2 = AnnounceKill(_mod,self);
      if (bVar2) {
        return;
      }
    }
  }
  iVar3 = FName::operator_cast_to_int((FName *)&message);
  switch(iVar3) {
  case 0x90:
    gendermessage._1016_8_ = anon_var_dwarf_32a526;
    break;
  case 0xa4:
    if (_mod == (AActor *)0x0) {
      gendermessage._1016_8_ = anon_var_dwarf_32a55a;
    }
    break;
  case 0xbf:
    gendermessage._1016_8_ = anon_var_dwarf_32a546;
    break;
  case 0xc0:
    gendermessage._1016_8_ = anon_var_dwarf_32a550;
    break;
  case 0xc2:
    gendermessage._1016_8_ = anon_var_dwarf_32a51c;
    break;
  case 0xc3:
    gendermessage._1016_8_ = anon_var_dwarf_32a512;
    break;
  case 0xc4:
    gendermessage._1016_8_ = anon_var_dwarf_32a530;
  }
  if (((inflictor != (AActor *)0x0) && (inflictor->player != (player_t *)0x0)) &&
     (inflictor->player->mo != (APlayerPawn *)inflictor)) {
    gendermessage._1016_8_ = anon_var_dwarf_32a564;
  }
  if (gendermessage._1016_8_ != 0) {
    messagename = FStringTable::operator()(&GStrings,(char *)gendermessage._1016_8_);
  }
  if ((_mod != (AActor *)0x0) && (messagename == (char *)0x0)) {
    if (_mod == self) {
      messagename = FStringTable::operator()(&GStrings,"OB_KILLEDSELF");
    }
    else if (_mod->player == (player_t *)0x0) {
      bVar2 = FName::operator==((FName *)&message,NAME_Telefrag);
      if (bVar2) {
        messagename = FStringTable::operator()(&GStrings,"OB_MONTELEFRAG");
      }
      else {
        bVar2 = FName::operator==((FName *)&message,NAME_Melee);
        if (bVar2) {
          pMVar5 = AActor::GetClass(_mod);
          bVar2 = FString::IsNotEmpty(&pMVar5->HitObituary);
          if (bVar2) {
            pMVar5 = AActor::GetClass(_mod);
            messagename = FString::operator_cast_to_char_(&pMVar5->HitObituary);
            goto LAB_005648d0;
          }
        }
        pMVar5 = AActor::GetClass(_mod);
        bVar2 = FString::IsNotEmpty(&pMVar5->Obituary);
        if (bVar2) {
          pMVar5 = AActor::GetClass(_mod);
          messagename = FString::operator_cast_to_char_(&pMVar5->Obituary);
        }
      }
    }
  }
LAB_005648d0:
  pAVar1 = self;
  inflictor_local = self;
  if (((messagename == (char *)0x0) && (pAVar1 = self, _mod != (AActor *)0x0)) &&
     (pAVar1 = self, _mod->player != (player_t *)0x0)) {
    if ((self->player == _mod->player) || (bVar2 = AActor::IsTeammate(self,_mod), !bVar2)) {
      bVar2 = FName::operator==((FName *)&message,NAME_Telefrag);
      if (bVar2) {
        messagename = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG");
      }
      pAVar1 = _mod;
      if (messagename == (char *)0x0) {
        if (inflictor != (AActor *)0x0) {
          pMVar5 = AActor::GetClass(inflictor);
          bVar2 = FString::IsNotEmpty(&pMVar5->Obituary);
          if (bVar2) {
            pMVar5 = AActor::GetClass(inflictor);
            messagename = FString::operator_cast_to_char_(&pMVar5->Obituary);
          }
        }
        if (((messagename == (char *)0x0) && ((message._4_4_ & 0x20) != 0)) &&
           (_mod->player->ReadyWeapon != (AWeapon *)0x0)) {
          pMVar6 = AWeapon::GetClass(_mod->player->ReadyWeapon);
          messagename = FString::operator_cast_to_char_
                                  (&(pMVar6->super_PClassInventory).super_PClassActor.Obituary);
        }
        if (messagename == (char *)0x0) {
          iVar3 = FName::operator_cast_to_int((FName *)&message);
          if (iVar3 == 0xc5) {
            gendermessage._1016_8_ = anon_var_dwarf_32a5bb;
          }
          else if (iVar3 == 200) {
            gendermessage._1016_8_ = anon_var_dwarf_32a5b0;
          }
          if (gendermessage._1016_8_ != 0) {
            messagename = FStringTable::operator()(&GStrings,(char *)gendermessage._1016_8_);
          }
        }
        pAVar1 = _mod;
        if (messagename == (char *)0x0) {
          pMVar5 = AActor::GetClass(_mod);
          messagename = FString::operator_cast_to_char_(&pMVar5->Obituary);
          pAVar1 = _mod;
        }
      }
    }
    else {
      inflictor_local = _mod;
      local_43c = userinfo_t::GetGender(&_mod->player->userinfo);
      uVar4 = FRandom::operator()(&pr_obituary);
      mysnprintf(local_438,0x400,"OB_FRIENDLY%c",(ulong)((uVar4 & 3) + 0x31));
      messagename = FStringTable::operator()(&GStrings,local_438);
      pAVar1 = _mod;
    }
  }
  _mod = pAVar1;
  if ((messagename != (char *)0x0) && (*messagename == '$')) {
    messagename = FStringTable::operator[](&GStrings,messagename + 1);
  }
  if (messagename == (char *)0x0) {
    messagename = FStringTable::operator()(&GStrings,"OB_DEFAULT");
  }
  if ((messagename != (char *)0x0) && (sVar7 = strlen(messagename), sVar7 != 0)) {
    victim = userinfo_t::GetName(&inflictor_local->player->userinfo);
    killer = userinfo_t::GetName(&_mod->player->userinfo);
    SexMessage(messagename,local_438,local_43c,victim,killer);
    Printf(1,"%s\n",local_438);
  }
  return;
}

Assistant:

void ClientObituary (AActor *self, AActor *inflictor, AActor *attacker, int dmgflags)
{
	FName mod;
	const char *message;
	const char *messagename;
	char gendermessage[1024];
	int  gender;

	// No obituaries for non-players, voodoo dolls or when not wanted
	if (self->player == NULL || self->player->mo != self || !show_obituaries)
		return;

	gender = self->player->userinfo.GetGender();

	// Treat voodoo dolls as unknown deaths
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
		MeansOfDeath = NAME_None;

	mod = MeansOfDeath;
	message = NULL;
	messagename = NULL;

	if (attacker == NULL || attacker->player != NULL)
	{
		if (mod == NAME_Telefrag)
		{
			if (AnnounceTelefrag (attacker, self))
				return;
		}
		else
		{
			if (AnnounceKill (attacker, self))
				return;
		}
	}

	switch (mod)
	{
	case NAME_Suicide:		messagename = "OB_SUICIDE";		break;
	case NAME_Falling:		messagename = "OB_FALLING";		break;
	case NAME_Crush:		messagename = "OB_CRUSH";		break;
	case NAME_Exit:			messagename = "OB_EXIT";		break;
	case NAME_Drowning:		messagename = "OB_WATER";		break;
	case NAME_Slime:		messagename = "OB_SLIME";		break;
	case NAME_Fire:			if (attacker == NULL) messagename = "OB_LAVA";		break;
	}

	// Check for being killed by a voodoo doll.
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
	{
		messagename = "OB_VOODOO";
	}

	if (messagename != NULL)
		message = GStrings(messagename);

	if (attacker != NULL && message == NULL)
	{
		if (attacker == self)
		{
			message = GStrings("OB_KILLEDSELF");
		}
		else if (attacker->player == NULL)
		{
			if (mod == NAME_Telefrag)
			{
				message = GStrings("OB_MONTELEFRAG");
			}
			else if (mod == NAME_Melee && attacker->GetClass()->HitObituary.IsNotEmpty())
			{
				message = attacker->GetClass()->HitObituary;
			}
			else if (attacker->GetClass()->Obituary.IsNotEmpty())
			{
				message = attacker->GetClass()->Obituary;
			}
		}
	}

	if (message == NULL && attacker != NULL && attacker->player != NULL)
	{
		if (self->player != attacker->player && self->IsTeammate(attacker))
		{
			self = attacker;
			gender = self->player->userinfo.GetGender();
			mysnprintf (gendermessage, countof(gendermessage), "OB_FRIENDLY%c", '1' + (pr_obituary() & 3));
			message = GStrings(gendermessage);
		}
		else
		{
			if (mod == NAME_Telefrag) message = GStrings("OB_MPTELEFRAG");
			if (message == NULL)
			{
				if (inflictor != NULL && inflictor->GetClass()->Obituary.IsNotEmpty())
				{
					message = inflictor->GetClass()->Obituary;
				}
				if (message == NULL && (dmgflags & DMG_PLAYERATTACK) && attacker->player->ReadyWeapon != NULL)
				{
					message = attacker->player->ReadyWeapon->GetClass()->Obituary;
				}
				if (message == NULL)
				{
					switch (mod)
					{
					case NAME_BFGSplash:	messagename = "OB_MPBFG_SPLASH";	break;
					case NAME_Railgun:		messagename = "OB_RAILGUN";			break;
					}
					if (messagename != NULL)
						message = GStrings(messagename);
				}
				if (message == NULL)
				{
					message = attacker->GetClass()->Obituary;
				}
			}
		}
	}
	else attacker = self;	// for the message creation

	if (message != NULL && message[0] == '$') 
	{
		message = GStrings[message+1];
	}

	if (message == NULL)
	{
		message = GStrings("OB_DEFAULT");
	}

	// [CK] Don't display empty strings
	if (message == NULL || strlen(message) <= 0)
		return;
		
	SexMessage (message, gendermessage, gender,
		self->player->userinfo.GetName(), attacker->player->userinfo.GetName());
	Printf (PRINT_MEDIUM, "%s\n", gendermessage);
}